

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xreq.c
# Opt level: O0

void xreq0_recv_cb(void *arg)

{
  long lVar1;
  nng_err nVar2;
  uint32_t pid;
  int iVar3;
  nni_msg *m;
  size_t sVar4;
  byte *data;
  bool bVar5;
  uint8_t *body;
  _Bool end;
  nni_msg *msg;
  xreq0_sock *sock;
  xreq0_pipe *p;
  void *arg_local;
  
  lVar1 = *(long *)((long)arg + 8);
  nVar2 = nni_aio_result((nni_aio *)((long)arg + 0x3a0));
  if (nVar2 == NNG_OK) {
    m = nni_aio_get_msg((nni_aio *)((long)arg + 0x3a0));
    nni_aio_set_msg((nni_aio *)((long)arg + 0x3a0),(nni_msg *)0x0);
    pid = nni_pipe_id(*arg);
    nni_msg_set_pipe(m,pid);
    bVar5 = false;
    while (!bVar5) {
      sVar4 = nni_msg_len(m);
      if (sVar4 < 4) {
        nni_msg_free(m);
        nni_pipe_close(*arg);
        return;
      }
      data = (byte *)nni_msg_body(m);
      bVar5 = (*data & 0x80) != 0;
      iVar3 = nng_msg_header_append(m,data,4);
      if (iVar3 != 0) {
        nni_msg_free(m);
        nni_pipe_close(*arg);
        return;
      }
      nni_msg_trim(m,4);
    }
    nni_aio_set_msg((nni_aio *)((long)arg + 0x568),m);
    nni_msgq_aio_put(*(nni_msgq **)(lVar1 + 8),(nni_aio *)((long)arg + 0x568));
  }
  else {
    nni_pipe_close(*arg);
  }
  return;
}

Assistant:

static void
xreq0_recv_cb(void *arg)
{
	xreq0_pipe *p    = arg;
	xreq0_sock *sock = p->req;
	nni_msg    *msg;
	bool        end;

	if (nni_aio_result(&p->aio_recv) != 0) {
		nni_pipe_close(p->pipe);
		return;
	}

	msg = nni_aio_get_msg(&p->aio_recv);
	nni_aio_set_msg(&p->aio_recv, NULL);
	nni_msg_set_pipe(msg, nni_pipe_id(p->pipe));
	end = false;

	while (!end) {
		uint8_t *body;

		if (nni_msg_len(msg) < 4) {
			// Peer gave us garbage, so kick it.
			nni_msg_free(msg);
			nni_pipe_close(p->pipe);
			return;
		}
		body = nni_msg_body(msg);
		end  = ((body[0] & 0x80u) != 0);

		if (nng_msg_header_append(msg, body, sizeof(uint32_t)) != 0) {
			// TODO: bump a no-memory stat
			nni_msg_free(msg);
			// Closing the pipe may release some memory.
			// It at least gives an indication to the peer
			// that we've lost the message.
			nni_pipe_close(p->pipe);
			return;
		}
		nni_msg_trim(msg, sizeof(uint32_t));
	}
	nni_aio_set_msg(&p->aio_putq, msg);
	nni_msgq_aio_put(sock->urq, &p->aio_putq);
}